

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmCommand * __thiscall cmState::GetCommand(cmState *this,string *name)

{
  const_iterator cVar1;
  cmCommand *pcVar2;
  string sName;
  string local_30;
  
  cmsys::SystemTools::LowerCase(&local_30,name);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
          ::find(&(this->ScriptedCommands)._M_t,&local_30);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header) {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
            ::find(&(this->BuiltinCommands)._M_t,&local_30);
    if ((_Rb_tree_header *)cVar1._M_node ==
        &(this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header) {
      pcVar2 = (cmCommand *)0x0;
      goto LAB_00266800;
    }
  }
  pcVar2 = *(cmCommand **)(cVar1._M_node + 2);
LAB_00266800:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pcVar2;
}

Assistant:

cmCommand* cmState::GetCommand(std::string const& name) const
{
  std::string sName = cmSystemTools::LowerCase(name);
  std::map<std::string, cmCommand*>::const_iterator pos;
  pos = this->ScriptedCommands.find(sName);
  if (pos != this->ScriptedCommands.end()) {
    return pos->second;
  }
  pos = this->BuiltinCommands.find(sName);
  if (pos != this->BuiltinCommands.end()) {
    return pos->second;
  }
  return CM_NULLPTR;
}